

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O2

boolean compress_output(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JDIMENSION JVar1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  uint uVar4;
  jpeg_c_coef_controller *pjVar5;
  jpeg_component_info *pjVar6;
  uint uVar7;
  boolean bVar8;
  JBLOCKARRAY ppaJVar9;
  ulong uVar10;
  JBLOCKROW paJVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  JBLOCKARRAY buffer [4];
  JBLOCKROW MCU_buffer [10];
  
  pjVar5 = cinfo->coef;
  JVar1 = cinfo->total_iMCU_rows;
  JVar2 = cinfo->MCUs_per_row;
  for (lVar18 = 0; lVar18 < cinfo->comps_in_scan; lVar18 = lVar18 + 1) {
    JVar3 = cinfo->cur_comp_info[lVar18]->v_samp_factor;
    ppaJVar9 = (*cinfo->mem->access_virt_barray)
                         ((j_common_ptr)cinfo,
                          *(jvirt_barray_ptr *)
                           (pjVar5[2].start_pass +
                           (long)cinfo->cur_comp_info[lVar18]->component_index * 8),
                          *(int *)&pjVar5[1].start_pass * JVar3,JVar3,0);
    buffer[lVar18] = ppaJVar9;
  }
  lVar18 = (long)*(int *)&pjVar5[1].compress_data;
  do {
    if (*(int *)((long)&pjVar5[1].compress_data + 4) <= lVar18) {
      *(int *)&pjVar5[1].start_pass = *(int *)&pjVar5[1].start_pass + 1;
      start_iMCU_row(cinfo);
      return 1;
    }
    for (uVar15 = *(uint *)((long)&pjVar5[1].start_pass + 4); uVar15 < cinfo->MCUs_per_row;
        uVar15 = uVar15 + 1) {
      uVar12 = 0;
      uVar10 = (ulong)(uint)cinfo->comps_in_scan;
      if (cinfo->comps_in_scan < 1) {
        uVar10 = uVar12;
      }
      iVar13 = 0;
      for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        pjVar6 = cinfo->cur_comp_info[uVar12];
        uVar4 = pjVar6->MCU_width;
        uVar16 = uVar4;
        if (JVar2 - 1 <= uVar15) {
          uVar16 = pjVar6->last_col_width;
        }
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        uVar7 = pjVar6->MCU_height;
        if (pjVar6->MCU_height < 1) {
          uVar7 = 0;
        }
        for (uVar17 = 0; uVar17 != uVar7; uVar17 = uVar17 + 1) {
          if ((*(uint *)&pjVar5[1].start_pass < JVar1 - 1) ||
             (uVar19 = 0, (long)(uVar17 + lVar18) < (long)pjVar6->last_row_height)) {
            paJVar11 = buffer[uVar12][uVar17 + lVar18] + uVar4 * uVar15;
            for (lVar14 = 0; uVar16 != (uint)lVar14; lVar14 = lVar14 + 1) {
              MCU_buffer[iVar13 + lVar14] = paJVar11;
              paJVar11 = paJVar11 + 1;
            }
            iVar13 = iVar13 + (uint)lVar14;
            uVar19 = uVar16;
          }
          for (lVar14 = 0; (int)(uVar19 + (int)lVar14) < (int)uVar4; lVar14 = lVar14 + 1) {
            paJVar11 = (JBLOCKROW)(&pjVar5[2].compress_data)[iVar13 + lVar14];
            MCU_buffer[iVar13 + lVar14] = paJVar11;
            (*paJVar11)[0] = *(JCOEF *)buffer[(long)iVar13 + lVar14 + 3];
          }
          iVar13 = iVar13 + (int)lVar14;
        }
      }
      bVar8 = (*cinfo->entropy->encode_mcu)(cinfo,MCU_buffer);
      if (bVar8 == 0) {
        *(int *)&pjVar5[1].compress_data = (int)lVar18;
        *(uint *)((long)&pjVar5[1].start_pass + 4) = uVar15;
        return 0;
      }
    }
    *(undefined4 *)((long)&pjVar5[1].start_pass + 4) = 0;
    lVar18 = lVar18 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
compress_output (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, blockcnt;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW MCU_buffer[C_MAX_BLOCKS_IN_MCU];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[compptr->component_index],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, FALSE);
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num < cinfo->MCUs_per_row;
	 MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	start_col = MCU_col_num * compptr->MCU_width;
	blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						: compptr->last_col_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (coef->iMCU_row_num < last_iMCU_row ||
	      yindex+yoffset < compptr->last_row_height) {
	    /* Fill in pointers to real blocks in this row */
	    buffer_ptr = buffer[ci][yindex+yoffset] + start_col;
	    for (xindex = 0; xindex < blockcnt; xindex++)
	      MCU_buffer[blkn++] = buffer_ptr++;
	  } else {
	    /* At bottom of image, need a whole row of dummy blocks */
	    xindex = 0;
	  }
	  /* Fill in any dummy blocks needed in this row.
	   * Dummy blocks are filled in the same way as in jccoefct.c:
	   * all zeroes in the AC entries, DC entries equal to previous
	   * block's DC value.  The init routine has already zeroed the
	   * AC entries, so we need only set the DC entries correctly.
	   */
	  for (; xindex < compptr->MCU_width; xindex++) {
	    MCU_buffer[blkn] = coef->dummy_buffer[blkn];
	    MCU_buffer[blkn][0][0] = MCU_buffer[blkn-1][0][0];
	    blkn++;
	  }
	}
      }
      /* Try to write the MCU. */
      if (! (*cinfo->entropy->encode_mcu) (cinfo, MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->mcu_ctr = MCU_col_num;
	return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}